

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TermAlgebra.cpp
# Opt level: O2

uint __thiscall Shell::TermAlgebra::getSubtermPredicate(TermAlgebra *this)

{
  Symbol *this_00;
  Signature *this_01;
  uint uVar1;
  OperatorType *type;
  bool added;
  bool local_49;
  undefined1 local_48 [40];
  
  this_01 = DAT_00a14190;
  getSubtermPredicateName_abi_cxx11_((string *)local_48,this);
  uVar1 = Kernel::Signature::addPredicate
                    (this_01,(string *)local_48,
                     (*(uint *)((this->_sort)._content + 0xc) & 0xfffffff) + 2,&local_49);
  std::__cxx11::string::~string((string *)local_48);
  if (local_49 == true) {
    local_48._16_8_ = 0;
    local_48._24_8_ = 0;
    local_48._0_8_ = (pointer)0x0;
    local_48._8_8_ = (TermList *)0x0;
    Lib::Stack<Kernel::TermList>::push
              ((Stack<Kernel::TermList> *)local_48,(TermList)(this->_sort)._content);
    Lib::Stack<Kernel::TermList>::push
              ((Stack<Kernel::TermList> *)local_48,(TermList)(this->_sort)._content);
    this_00 = (DAT_00a14190->_preds)._stack[uVar1];
    type = Kernel::OperatorType::getPredicateType
                     ((uint)((ulong)(local_48._16_8_ - local_48._8_8_) >> 3),
                      (TermList *)local_48._8_8_,*(uint *)((this->_sort)._content + 0xc) & 0xfffffff
                     );
    Kernel::Signature::Symbol::setType(this_00,type);
    Lib::Stack<Kernel::TermList>::~Stack((Stack<Kernel::TermList> *)local_48);
  }
  return uVar1;
}

Assistant:

unsigned TermAlgebra::getSubtermPredicate() {
  bool added;
  unsigned s = env.signature->addPredicate(getSubtermPredicateName(), nTypeArgs()+2, added);

  if (added) {
    // declare a binary predicate subterm
    TermStack args;
    args.push(_sort);
    args.push(_sort);
    env.signature->getPredicate(s)->setType(OperatorType::getPredicateType(args.size(),args.begin(),nTypeArgs()));
  }

  return s;
}